

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

bool __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::VerifyMark
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,void *objectAddress,void *target)

{
  bool bVar1;
  BOOLEAN BVar2;
  ushort uVar3;
  Recycler *pRVar4;
  SmallHeapBlockBitVector *this_00;
  bool isMarked;
  ushort bitIndex;
  void *target_local;
  void *objectAddress_local;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_local;
  
  pRVar4 = HeapBucket::GetRecycler(this->heapBucket);
  bVar1 = HeapBlockMap64::IsAddressInNewChunk(&pRVar4->heapBlockMap,target);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    uVar3 = GetAddressBitIndex(target);
    this_00 = GetMarkedBitVector(this);
    BVar2 = BVStatic<2048UL>::Test(this_00,(uint)uVar3);
    this_local._7_1_ = BVar2 == '\x01';
    if (!this_local._7_1_) {
      pRVar4 = GetRecycler(this);
      HeapBlock::PrintVerifyMarkFailure(pRVar4,(char *)objectAddress,(char *)target);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
SmallHeapBlockT<TBlockAttributes>::VerifyMark(void * objectAddress, void * target)
{
    // Because we mark through new object, we might have a false reference
    // somewhere that we have scanned before this new block is allocated
    // so the object will not be marked even though it looks like a reference
    // Can't verify when the block is new
    if (this->heapBucket->GetRecycler()->heapBlockMap.IsAddressInNewChunk(target))
    {
        return false;
    }

    ushort bitIndex = GetAddressBitIndex(target);
    bool isMarked = this->GetMarkedBitVector()->Test(bitIndex) == TRUE;
#if DBG
    if (!isMarked)
    {
        PrintVerifyMarkFailure(this->GetRecycler(), (char*)objectAddress, (char*)target);
    }
#else
    if (!isMarked)
    {
        DebugBreak();
    }
#endif
    return isMarked;
}